

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::ContainerPrinter::PrintValue<std::array<unsigned_long,4ul>,void>
               (array<unsigned_long,_4UL> *container,ostream *os)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  char local_35;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_33,1);
  lVar2 = 0;
  lVar1 = 0;
  do {
    if (lVar2 == 0) {
LAB_00149fb6:
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_32,1);
      std::ostream::_M_insert<unsigned_long>((ulong)os);
      lVar2 = lVar2 + 1;
      bVar3 = false;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_31,1);
      if (lVar2 != 0x20) goto LAB_00149fb6;
      std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
      lVar2 = 0x20;
      bVar3 = true;
    }
    if ((bVar3) || (bVar3 = lVar1 == 0x18, lVar1 = lVar1 + 8, bVar3)) {
      if (lVar2 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_34,1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_35,1);
      return;
    }
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }